

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O1

void __thiscall
insyde_fdm_t::fdm_entries_t::fdm_entries_t
          (fdm_entries_t *this,kstream *p__io,insyde_fdm_t *p__parent,insyde_fdm_t *p__root)

{
  (this->super_kstruct).m__io = p__io;
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__fdm_entries_t_00184f10;
  (this->m_entries)._M_t.
  super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_*,_false>
  ._M_head_impl =
       (vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>
        *)0x0;
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>_>
           *)&this->m_entries,(pointer)0x0);
  _read(this);
  return;
}

Assistant:

insyde_fdm_t::fdm_entries_t::fdm_entries_t(kaitai::kstream* p__io, insyde_fdm_t* p__parent, insyde_fdm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_entries = nullptr;
    _read();
}